

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O1

bool tcmalloc::anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
               (unsigned_long *outptr,char *text,int base,int c,char **endptr)

{
  char *pcVar1;
  bool bVar2;
  ulonglong uVar3;
  undefined4 in_register_00000014;
  char **text_pointer;
  char *local_40;
  char *local_38;
  char *endptr_extract;
  
  text_pointer = (char **)CONCAT44(in_register_00000014,base);
  pcVar1 = *text_pointer;
  *text_pointer = (char *)0x0;
  bVar2 = ExtractUntilChar(pcVar1,(int)text,&local_38);
  if (bVar2) {
    uVar3 = strtoull(pcVar1,&local_40,0x10);
    *local_38 = (char)text;
    if (local_38 == local_40) {
      *text_pointer = local_38;
      SkipWhileWhitespace(text_pointer,(int)text);
      goto LAB_00119d6f;
    }
  }
  uVar3 = 0;
LAB_00119d6f:
  *outptr = uVar3;
  pcVar1 = *text_pointer;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    bVar2 = false;
  }
  else {
    *text_pointer = pcVar1 + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool StringToIntegerUntilCharWithCheck(
    T *outptr, char *text, int base, int c, char **endptr) {
  *outptr = StringToIntegerUntilChar<T>(*endptr, base, c, endptr);
  if (*endptr == nullptr || **endptr == '\0') return false;
  ++(*endptr);
  return true;
}